

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*,unsigned_int,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ImmutableSamplerDesc&)>
          (Serializer<(Diligent::SerializerMode)0> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **DstArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)0>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  bool bVar1;
  ImmutableSamplerDesc *pIVar2;
  char (*Args_1) [20];
  ulong uVar3;
  ImmutableSamplerDesc *pIVar4;
  string msg;
  string local_58;
  ImmutableSamplerDesc **local_38;
  
  Args_1 = (char (*) [20])Count;
  if (Allocator == (DynamicLinearAllocator *)0x0) {
    FormatString<char[26],char[21]>
              (&local_58,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x3664b2,
               (char (*) [21])Count);
    Args_1 = (char (*) [20])0x1d3;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (*DstArray != (ImmutableSamplerDesc *)0x0) {
    FormatString<char[26],char[20]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DstArray == nullptr",Args_1);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = Copy<unsigned_int>(this,Count,4);
  if (bVar1) {
    local_38 = DstArray;
    pIVar2 = DynamicLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                       (Allocator,(ulong)*Count);
    bVar1 = *Count == 0;
    if (!bVar1) {
      uVar3 = 0;
      pIVar4 = pIVar2;
      do {
        bVar1 = (*ElemSerializer)(this,pIVar4);
        if (!bVar1) goto LAB_002bca74;
        uVar3 = uVar3 + 1;
        pIVar4 = pIVar4 + 1;
        bVar1 = uVar3 >= *Count;
      } while (uVar3 < *Count);
    }
    *local_38 = pIVar2;
  }
  else {
LAB_002bca74:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Serializer<SerializerMode::Read>::SerializeArray(DynamicLinearAllocator* Allocator,
                                                      ElemPtrType&            DstArray,
                                                      CountType&              Count,
                                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR(Allocator != nullptr);
    VERIFY_EXPR(DstArray == nullptr);

    if (!(*this)(Count))
        return false;

    auto* pDstElements = Allocator->ConstructArray<RawType<decltype(DstArray[0])>>(Count);
    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, pDstElements[i]))
            return false;
    }
    DstArray = pDstElements;

    return true;
}